

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_connection.c
# Opt level: O0

void send_greeting_header(apx_clientConnection_t *self)

{
  int iVar1;
  size_t sVar2;
  apx_connectionInterface_t *paVar3;
  int32_t local_b4;
  char **ppcStack_b0;
  int32_t bytes_available;
  char *p;
  char greeting [127];
  int num_header_format;
  apx_connectionInterface_t *connection;
  int32_t greeting_size;
  apx_clientConnection_t *self_local;
  
  stack0xffffffffffffffdc = 0x20;
  ppcStack_b0 = &p;
  strcpy((char *)&p,"RMFP/1.0\n");
  sVar2 = strlen((char *)&p);
  ppcStack_b0 = (char **)(sVar2 + (long)ppcStack_b0);
  iVar1 = sprintf((char *)ppcStack_b0,"%s%d\n\n","NumHeader-Format:",(ulong)stack0xffffffffffffffdc)
  ;
  ppcStack_b0 = (char **)((long)ppcStack_b0 + (long)iVar1);
  iVar1 = (int)ppcStack_b0;
  paVar3 = apx_connectionBase_get_connection(&self->base);
  if (paVar3 != (apx_connectionInterface_t *)0x0) {
    local_b4 = 0;
    if (((paVar3->transmit_begin == (apx_void_ptr_func_t *)0x0) ||
        (paVar3->transmit_end == (apx_void_ptr_func_t *)0x0)) ||
       (paVar3->transmit_direct_message == (apx_connection_transmit_direct_message_func *)0x0)) {
      __assert_fail("(connection->transmit_begin != NULL) && (connection->transmit_end != NULL) && (connection->transmit_direct_message != NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_connection.c"
                    ,0x134,"void send_greeting_header(apx_clientConnection_t *)");
    }
    (*paVar3->transmit_begin)(paVar3->arg);
    (*paVar3->transmit_direct_message)(paVar3->arg,(uint8_t *)&p,iVar1 - (int)&p,&local_b4);
    (*paVar3->transmit_end)(paVar3->arg);
  }
  return;
}

Assistant:

static void send_greeting_header(apx_clientConnection_t* self)
{
   int32_t greeting_size;
   apx_connectionInterface_t const* connection;
   int num_header_format = 32;
   char greeting[RMF_GREETING_MAX_LEN];
   char* p = &greeting[0];
   strcpy(greeting, RMF_GREETING_START);
   p += strlen(greeting);
   p += sprintf(p, "%s%d\n\n", RMF_NUMHEADER_FORMAT_HDR, num_header_format);
   greeting_size = (int32_t)(p - greeting);
   connection = apx_connectionBase_get_connection(&self->base);
   if (connection != NULL)
   {
      int32_t bytes_available = 0;
      assert((connection->transmit_begin != NULL) && (connection->transmit_end != NULL) && (connection->transmit_direct_message != NULL));
      connection->transmit_begin(connection->arg);
      connection->transmit_direct_message(connection->arg, (uint8_t const*)greeting, greeting_size, &bytes_available);
      connection->transmit_end(connection->arg);
   }
}